

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.h
# Opt level: O2

void __thiscall
Fixpp::result::
Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fixpp::ErrorKind>
::Result(Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fixpp::ErrorKind>
         *this,Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fixpp::ErrorKind>
               *other)

{
  bool bVar1;
  
  (this->storage_).initialized_ = false;
  bVar1 = other->ok_ != true;
  if (bVar1) {
    details::Storage<std::__cxx11::string,Fixpp::ErrorKind>::rawConstruct<Fixpp::ErrorKind_const&>
              ((Storage<std::__cxx11::string,Fixpp::ErrorKind> *)&this->storage_,
               (ErrorKind *)&other->storage_);
  }
  else {
    details::Storage<std::__cxx11::string,Fixpp::ErrorKind>::
    rawConstruct<std::__cxx11::string_const&>
              ((Storage<std::__cxx11::string,Fixpp::ErrorKind> *)&this->storage_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&other->storage_
              );
  }
  this->ok_ = !bVar1;
  return;
}

Assistant:

Result(const Result& other) {
        if (other.isOk()) {
            details::Constructor<T, E>::copy(other.storage_, storage_, details::ok_tag());
            ok_ = true;
        } else {
            details::Constructor<T, E>::copy(other.storage_, storage_, details::err_tag());
            ok_ = false;
        }
    }